

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  uint uVar1;
  int iVar2;
  LogMessage *other;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  RepeatedField<int> *pRVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar7;
  void *extraout_RDX;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64 uVar11;
  ulong uVar12;
  int i;
  long lVar13;
  int i_4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->is_repeated == true) {
    if (this->is_packed != true) {
      sVar4 = WireFormatLite::TagSize(number,(uint)this->type);
      switch(this->type) {
      case '\x01':
      case '\x06':
      case '\x10':
        lVar13 = sVar4 + 8;
        break;
      case '\x02':
      case '\a':
      case '\x0f':
        lVar13 = sVar4 + 4;
        break;
      case '\x03':
        uVar1 = ((this->field_0).repeated_int32_value)->current_size_;
        sVar4 = sVar4 * uVar1;
        uVar10 = 0;
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = (ulong)uVar1;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar8 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                            uVar10 * 8) | 1;
          lVar13 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
            }
          }
          sVar4 = sVar4 + ((int)lVar13 * 9 + 0x49U >> 6);
        }
        return sVar4;
      case '\x04':
        uVar1 = ((this->field_0).repeated_int32_value)->current_size_;
        sVar4 = sVar4 * uVar1;
        uVar10 = 0;
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = (ulong)uVar1;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar8 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                            uVar10 * 8) | 1;
          lVar13 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
            }
          }
          sVar4 = sVar4 + ((int)lVar13 * 9 + 0x49U >> 6);
        }
        return sVar4;
      case '\x05':
        pRVar6 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar6->current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          sVar3 = io::CodedOutputStream::VarintSize32SignExtended
                            (*(int32 *)((long)pRVar6->arena_or_elements_ + lVar13 * 4));
          sVar4 = sVar4 + sVar3;
          pRVar6 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar6->current_size_;
        }
        return sVar4;
      case '\b':
        lVar13 = sVar4 + 1;
        break;
      case '\t':
        pRVar7 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          sVar3 = WireFormatLite::StringSize
                            ((string *)((pRVar7->super_RepeatedPtrFieldBase).rep_)->elements[lVar13]
                            );
          sVar4 = sVar4 + sVar3;
          pRVar7 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar4;
      case '\n':
        pRVar7 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          lVar5 = (**(code **)(*((pRVar7->super_RepeatedPtrFieldBase).rep_)->elements[lVar13] + 0x58
                              ))();
          sVar4 = sVar4 + lVar5;
          pRVar7 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar4;
      case '\v':
        pRVar7 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          sVar3 = WireFormatLite::MessageSize<google::protobuf::MessageLite>
                            ((MessageLite *)
                             ((pRVar7->super_RepeatedPtrFieldBase).rep_)->elements[lVar13]);
          sVar4 = sVar4 + sVar3;
          pRVar7 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar4;
      case '\f':
        pRVar7 = (this->field_0).repeated_string_value;
        uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          sVar3 = WireFormatLite::BytesSize
                            ((string *)((pRVar7->super_RepeatedPtrFieldBase).rep_)->elements[lVar13]
                            );
          sVar4 = sVar4 + sVar3;
          pRVar7 = (this->field_0).repeated_string_value;
          uVar10 = (ulong)(uint)(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        }
        return sVar4;
      case '\r':
        uVar1 = ((this->field_0).repeated_int32_value)->current_size_;
        sVar4 = sVar4 * uVar1;
        uVar10 = 0;
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = (ulong)uVar1;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar1 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           uVar10 * 4) | 1;
          iVar2 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          sVar4 = sVar4 + (iVar2 * 9 + 0x49U >> 6);
        }
        return sVar4;
      case '\x0e':
        pRVar6 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar6->current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          sVar3 = io::CodedOutputStream::VarintSize32SignExtended
                            (*(int32 *)((long)pRVar6->arena_or_elements_ + lVar13 * 4));
          sVar4 = sVar4 + sVar3;
          pRVar6 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar6->current_size_;
        }
        return sVar4;
      case '\x11':
        pRVar6 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar6->current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          sVar3 = WireFormatLite::SInt32Size
                            (*(int32 *)((long)pRVar6->arena_or_elements_ + lVar13 * 4));
          sVar4 = sVar4 + sVar3;
          pRVar6 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar6->current_size_;
        }
        return sVar4;
      case '\x12':
        pRVar6 = (this->field_0).repeated_int32_value;
        uVar10 = (ulong)(uint)pRVar6->current_size_;
        sVar4 = sVar4 * uVar10;
        for (lVar13 = 0; lVar13 < (int)uVar10; lVar13 = lVar13 + 1) {
          sVar3 = WireFormatLite::SInt64Size
                            (*(int64 *)((long)pRVar6->arena_or_elements_ + lVar13 * 8));
          sVar4 = sVar4 + sVar3;
          pRVar6 = (this->field_0).repeated_int32_value;
          uVar10 = (ulong)(uint)pRVar6->current_size_;
        }
        return sVar4;
      default:
        return 0;
      }
      return lVar13 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    }
    switch((uint)this->type) {
    case 1:
    case 6:
    case 0x10:
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case 2:
    case 7:
    case 0xf:
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case 3:
      uVar1 = ((this->field_0).repeated_int32_value)->current_size_;
      uVar8 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar8;
      }
      uVar10 = 0;
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        uVar12 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           uVar8 * 8) | 1;
        lVar13 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar10 = uVar10 + ((int)lVar13 * 9 + 0x49U >> 6);
      }
      break;
    case 4:
      uVar1 = ((this->field_0).repeated_int32_value)->current_size_;
      uVar8 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar8;
      }
      uVar10 = 0;
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        uVar12 = *(ulong *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                           uVar8 * 8) | 1;
        lVar13 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar10 = uVar10 + ((int)lVar13 * 9 + 0x49U >> 6);
      }
      break;
    case 5:
      uVar10 = 0;
      for (lVar13 = 0; lVar13 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar13 = lVar13 + 1) {
        sVar4 = io::CodedOutputStream::VarintSize32SignExtended
                          (*(int32 *)((long)((this->field_0).repeated_int32_value)->
                                            arena_or_elements_ + lVar13 * 4));
        uVar10 = uVar10 + sVar4;
      }
      break;
    case 8:
      uVar10 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x646);
      other = LogMessage::operator<<(&local_58,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_59,other);
      LogMessage::~LogMessage(&local_58);
    default:
      this->cached_size = 0;
      return 0;
    case 0xd:
      uVar1 = ((this->field_0).repeated_int32_value)->current_size_;
      uVar8 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar8;
      }
      uVar10 = 0;
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        uVar1 = *(uint *)((long)((this->field_0).repeated_int32_value)->arena_or_elements_ +
                         uVar8 * 4) | 1;
        iVar2 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar10 = uVar10 + (iVar2 * 9 + 0x49U >> 6);
      }
      break;
    case 0xe:
      uVar10 = 0;
      for (lVar13 = 0; lVar13 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar13 = lVar13 + 1) {
        sVar4 = io::CodedOutputStream::VarintSize32SignExtended
                          (*(int32 *)((long)((this->field_0).repeated_int32_value)->
                                            arena_or_elements_ + lVar13 * 4));
        uVar10 = uVar10 + sVar4;
      }
      break;
    case 0x11:
      uVar10 = 0;
      for (lVar13 = 0; lVar13 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar13 = lVar13 + 1) {
        sVar4 = WireFormatLite::SInt32Size
                          (*(int32 *)((long)((this->field_0).repeated_int32_value)->
                                            arena_or_elements_ + lVar13 * 4));
        uVar10 = uVar10 + sVar4;
      }
      break;
    case 0x12:
      uVar10 = 0;
      for (lVar13 = 0; lVar13 < ((this->field_0).repeated_int32_value)->current_size_;
          lVar13 = lVar13 + 1) {
        sVar4 = WireFormatLite::SInt64Size
                          (*(int64 *)((long)((this->field_0).repeated_int32_value)->
                                            arena_or_elements_ + lVar13 * 8));
        uVar10 = uVar10 + sVar4;
      }
    }
    this->cached_size = (uint)uVar10;
    if (uVar10 == 0) {
      return 0;
    }
    uVar1 = (uint)uVar10 | 1;
    iVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = (size_t)(iVar2 * 9 + 0x49U >> 6);
    uVar1 = number * 8 + 3;
    iVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = uVar10 + (iVar2 * 9 + 0x49U >> 6);
    goto LAB_00290f93;
  }
  if ((this->field_0xa & 1) != 0) {
    return 0;
  }
  uVar11 = (uint64)this->type;
  sVar3 = WireFormatLite::TagSize(number,(uint)this->type);
  switch(this->type) {
  case '\x01':
  case '\x06':
  case '\x10':
    return sVar3 + 8;
  case '\x02':
  case '\a':
  case '\x0f':
    return sVar3 + 4;
  case '\x03':
  case '\x04':
    uVar10 = (this->field_0).uint64_value | 1;
    lVar13 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    iVar2 = (int)lVar13;
    goto LAB_00290f8a;
  case '\x05':
  case '\x0e':
    sVar4 = io::CodedOutputStream::VarintSize32SignExtended((this->field_0).int32_value);
    break;
  case '\b':
    return sVar3 + 1;
  case '\t':
    sVar4 = WireFormatLite::StringSize((this->field_0).string_value);
    break;
  case '\n':
    sVar4 = (**(code **)(*(long *)(this->field_0).repeated_string_value + 0x58))
                      ((type_info *)(this->field_0).repeated_string_value,uVar11,extraout_RDX);
    break;
  case '\v':
    if ((this->field_0xa & 0x10) != 0) {
      uVar1 = (*((this->field_0).message_value)->_vptr_MessageLite[10])();
      sVar3 = sVar3 + (long)(int)uVar1;
      goto LAB_00290f84;
    }
    sVar4 = WireFormatLite::MessageSize<google::protobuf::MessageLite>
                      ((this->field_0).message_value);
    break;
  case '\f':
    sVar4 = WireFormatLite::BytesSize((this->field_0).string_value);
    break;
  case '\r':
    uVar1 = (this->field_0).uint32_value;
LAB_00290f84:
    iVar2 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
LAB_00290f8a:
    sVar4 = (size_t)(iVar2 * 9 + 0x49U >> 6);
    break;
  case '\x11':
    sVar4 = WireFormatLite::SInt32Size((this->field_0).int32_value);
    break;
  case '\x12':
    sVar4 = WireFormatLite::SInt64Size((this->field_0).int64_value);
    break;
  default:
    goto switchD_00290aa5_default;
  }
LAB_00290f93:
  sVar3 = sVar3 + sVar4;
switchD_00290aa5_default:
  return sVar3;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                     \
          repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += WireFormatLite::k##CAMELCASE##Size *               \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = ToCachedSize(result);
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    result += tag_size * FromIntSize(repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {        \
      result += WireFormatLite::CAMELCASE##Size(                            \
          repeated_##LOWERCASE##_value->Get(i));                            \
    }                                                                       \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *  \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_value);
      HANDLE_TYPE(INT64, Int64, int64_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_value);
      HANDLE_TYPE(SINT32, SInt32, int32_value);
      HANDLE_TYPE(SINT64, SInt64, int64_value);
      HANDLE_TYPE(STRING, String, *string_value);
      HANDLE_TYPE(BYTES, Bytes, *string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          size_t size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}